

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

logic_t slang::condWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t *puVar4;
  SVInt *pSVar5;
  logic_t lVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  if ((rhs->super_SVIntStorage).unknownFlag == false) {
    lVar6 = SVInt::operator==(lhs,rhs);
    return (logic_t)lVar6.value;
  }
  uVar2 = (lhs->super_SVIntStorage).bitWidth;
  uVar3 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar2 == uVar3) {
    lVar6.value = '\x01';
    if (0x3f < uVar2 + 0x3f) {
      puVar4 = (rhs->super_SVIntStorage).field_0.pVal;
      bVar1 = (lhs->super_SVIntStorage).unknownFlag;
      pSVar5 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
      if (bVar1 != false) {
        lhs = pSVar5;
      }
      if (0x40 < uVar2) {
        lhs = pSVar5;
      }
      uVar8 = (ulong)(uVar2 + 0x3f >> 6);
      lVar9 = 0;
      do {
        uVar10 = ~*(ulong *)((long)puVar4 + lVar9 + uVar8 * 8);
        if ((bVar1 != false) &&
           ((*(ulong *)((long)&(pSVar5->super_SVIntStorage).field_0 + lVar9 + uVar8 * 8) & uVar10)
            != 0)) {
          return (logic_t)0x80;
        }
        if (((*(ulong *)((long)puVar4 + lVar9) ^
             *(ulong *)((long)&(lhs->super_SVIntStorage).field_0 + lVar9)) & uVar10) != 0) {
          return (logic_t)'\0';
        }
        lVar9 = lVar9 + 8;
      } while (uVar8 * 8 - lVar9 != 0);
    }
  }
  else {
    bVar7 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar2 < uVar3) {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      lVar6 = condWildcardEqual((SVInt *)&local_28,rhs);
    }
    else {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      lVar6 = condWildcardEqual(lhs,(SVInt *)&local_28);
    }
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  return (logic_t)lVar6.value;
}

Assistant:

logic_t condWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!rhs.unknownFlag)
        return lhs == rhs;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return condWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return condWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the bits unknown on the rhs
        uint64_t mask = ~rhs.pVal[i + words];
        if (lhs.unknownFlag && (lhs.getRawData()[i + words] & mask) != 0)
            return logic_t::x;

        if ((lhs.getRawData()[i] & mask) != (rhs.pVal[i] & mask))
            return logic_t(false);
    }

    return logic_t(true);
}